

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libjsonnet++.cpp
# Opt level: O3

bool __thiscall
jsonnet::Jsonnet::evaluateFileMulti
          (Jsonnet *this,string *filename,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *outputs)

{
  char *pcVar1;
  char *jsonnet_output;
  bool bVar2;
  int error;
  int local_2c;
  
  if (outputs ==
      (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       *)0x0) {
    bVar2 = false;
  }
  else {
    local_2c = 0;
    jsonnet_output =
         (char *)jsonnet_evaluate_file_multi(this->vm_,(filename->_M_dataplus)._M_p,&local_2c);
    bVar2 = local_2c == 0;
    if (bVar2) {
      anon_unknown_1::parseMultiOutput(jsonnet_output,outputs);
    }
    else {
      pcVar1 = (char *)(this->last_error_)._M_string_length;
      strlen(jsonnet_output);
      std::__cxx11::string::_M_replace((ulong)&this->last_error_,0,pcVar1,(ulong)jsonnet_output);
    }
    jsonnet_realloc(this->vm_,jsonnet_output,0);
  }
  return bVar2;
}

Assistant:

bool Jsonnet::evaluateFileMulti(const std::string& filename,
                                std::map<std::string, std::string>* outputs)
{
    if (outputs == nullptr) {
        return false;
    }
    int error = 0;
    char* jsonnet_output = ::jsonnet_evaluate_file_multi(vm_, filename.c_str(), &error);
    if (error != 0) {
        last_error_.assign(jsonnet_output);
        jsonnet_realloc(vm_, jsonnet_output, 0);
        return false;
    }
    parseMultiOutput(jsonnet_output, outputs);
    jsonnet_realloc(vm_, jsonnet_output, 0);
    return true;
}